

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_PairwiseExprPrecedence_Test::TestBody
          (ExprWriterTest_PairwiseExprPrecedence_Test *this)

{
  NumericExpr then_expr;
  bool bVar1;
  ExprBase lhs;
  ExprBase other;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar;
  NumericExpr args [2];
  NumericConstant n1;
  NumericConstant n0;
  ExprWriterTest *in_stack_fffffffffffffe68;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  ExprBase in_stack_fffffffffffffe80;
  int line;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 uVar2;
  ExprBase condition;
  Type type;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 uVar3;
  CStringRef arg0;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *in_stack_fffffffffffffec8;
  Kind in_stack_fffffffffffffed4;
  ExprWriterTest *in_stack_fffffffffffffed8;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> message;
  AssertHelper *in_stack_fffffffffffffef0;
  BasicCStringRef<char> local_b0;
  string local_a8 [32];
  AssertionResult local_88;
  Message *local_78;
  Impl *local_68;
  BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38> local_58;
  ExprBase local_50;
  ExprBase local_40;
  BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38> local_30;
  char local_28 [8];
  Impl local_20 [2];
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_18;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_10;
  
  local_10.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffe68,6.17441742658139e-318);
  local_18.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffe68,6.17454588364931e-318);
  lhs.impl_ = (Impl *)(in_RDI + 0x10);
  local_40.impl_ = (Impl *)local_10.super_ExprBase.impl_;
  uVar3 = 0;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (NumericConstant)in_stack_fffffffffffffe80.impl_,
             (type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  local_50.impl_ = (Impl *)local_18.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (NumericConstant)in_stack_fffffffffffffe80.impl_,
             (type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  uVar2 = 0x19;
  local_30.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinary
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                  (Kind)((ulong)in_stack_fffffffffffffe70 >> 0x20),(NumericExpr)lhs.impl_,
                  (NumericExpr)in_stack_fffffffffffffe80.impl_);
  arg0.data_ = local_28;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
              )in_stack_fffffffffffffe80.impl_,(type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  condition.impl_ = local_20;
  local_68 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (NumericConstant)in_stack_fffffffffffffe80.impl_,
             (type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  local_78 = (Message *)local_18.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (NumericConstant)in_stack_fffffffffffffe80.impl_,
             (type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  local_58.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinary
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                  (Kind)((ulong)in_stack_fffffffffffffe70 >> 0x20),(NumericExpr)lhs.impl_,
                  (NumericExpr)in_stack_fffffffffffffe80.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
              )in_stack_fffffffffffffe80.impl_,(type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_b0,"{}");
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>::ArrayRef<2ul>
            (in_stack_fffffffffffffe70,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> (*) [2])in_stack_fffffffffffffe68);
  ExprWriterTest::MakePairwise
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
              )in_stack_fffffffffffffe80.impl_,(type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  message.super_ExprBase.impl_ = (ExprBase)(ExprBase)local_18;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (NumericConstant)in_stack_fffffffffffffe80.impl_,
             (type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (NumericConstant)in_stack_fffffffffffffe80.impl_,
             (type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  then_expr.super_ExprBase.impl_._4_4_ = uVar2;
  then_expr.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe90;
  other.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                                  ((BasicExprFactory<std::allocator<char>_> *)
                                   in_stack_fffffffffffffe80.impl_,(LogicalExpr)condition.impl_,
                                   then_expr,(NumericExpr)lhs.impl_);
  type = (Type)((ulong)condition.impl_ >> 0x20);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             other.impl_,(type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
                  CONCAT44(uVar3,in_stack_fffffffffffffea0));
  testing::internal::EqHelper<false>::Compare<char[32],std::__cxx11::string>
            ((char *)lhs.impl_,(char *)other.impl_,
             (char (*) [32])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe70);
  line = (int)((ulong)lhs.impl_ >> 0x20);
  std::__cxx11::string::~string(local_a8);
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)0x131485);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar3,in_stack_fffffffffffffea0));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x131522)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar3,in_stack_fffffffffffffea0),type,
               (char *)CONCAT44(uVar2,in_stack_fffffffffffffe90),line,(char *)other.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)message.super_ExprBase.impl_);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x131570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1315bf);
  return;
}

Assistant:

TEST_F(ExprWriterTest, PairwiseExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  NumericExpr args[] = {
    MakeBinary(ex::ADD, n0, n1), MakeBinary(ex::ADD, n0, n1)
  };
  CHECK_WRITE("if alldiff(0 + 1, 0 + 1) then 1",
      MakeIf(MakePairwise(ex::ALLDIFF, args), n1, n0));
}